

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O1

void __thiscall
spvtools::opt::CFG::ComputeStructuredOrder
          (CFG *this,Function *func,BasicBlock *root,BasicBlock *end,
          list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *order)

{
  IRContext *this_00;
  bool bVar1;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  this_00 = this->module_->context_;
  local_b0 = order;
  if ((this_00->feature_mgr_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
      .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
      (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(this_00);
  }
  bVar1 = EnumSet<spv::Capability>::contains
                    (&((this_00->feature_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                       .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl)
                      ->capabilities_,CapabilityShader);
  if (bVar1) {
    ComputeStructuredSuccessors(this,func);
    local_68._8_8_ = 0;
    pcStack_50 = std::
                 _Function_handler<const_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_*(const_spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:92:36)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<const_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_*(const_spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:92:36)>
               ::_M_manager;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    local_70 = std::
               _Function_handler<void_(const_spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:89:23)>
               ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(const_spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:89:23)>
               ::_M_manager;
    local_a8._8_8_ = 0;
    local_a8._M_unused._M_object = &local_b0;
    pcStack_90 = std::
                 _Function_handler<void_(const_spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:98:21)>
                 ::_M_invoke;
    local_98 = std::
               _Function_handler<void_(const_spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:98:21)>
               ::_M_manager;
    local_48._8_8_ = 0;
    pcStack_30 = std::
                 _Function_handler<bool_(const_spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:90:19)>
                 ::_M_invoke;
    local_38 = std::
               _Function_handler<bool_(const_spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:90:19)>
               ::_M_manager;
    local_68._M_unused._M_object = this;
    local_48._M_unused._M_object = end;
    CFA<spvtools::opt::BasicBlock>::DepthFirstTraversal
              (root,(get_blocks_func *)&local_68,
               (function<void_(const_spvtools::opt::BasicBlock_*)> *)&local_88,
               (function<void_(const_spvtools::opt::BasicBlock_*)> *)&local_a8,
               (function<bool_(const_spvtools::opt::BasicBlock_*)> *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    if (local_98 != (code *)0x0) {
      (*local_98)(&local_a8,&local_a8,__destroy_functor);
    }
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
    return;
  }
  __assert_fail("module_->context()->get_feature_mgr()->HasCapability( spv::Capability::Shader) && \"This only works on structured control flow\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp"
                ,0x55,
                "void spvtools::opt::CFG::ComputeStructuredOrder(Function *, BasicBlock *, BasicBlock *, std::list<BasicBlock *> *)"
               );
}

Assistant:

void CFG::ComputeStructuredOrder(Function* func, BasicBlock* root,
                                 BasicBlock* end,
                                 std::list<BasicBlock*>* order) {
  assert(module_->context()->get_feature_mgr()->HasCapability(
             spv::Capability::Shader) &&
         "This only works on structured control flow");

  // Compute structured successors and do DFS.
  ComputeStructuredSuccessors(func);
  auto ignore_block = [](cbb_ptr) {};
  auto terminal = [end](cbb_ptr bb) { return bb == end; };

  auto get_structured_successors = [this](const BasicBlock* b) {
    return &(block2structured_succs_[b]);
  };

  // TODO(greg-lunarg): Get rid of const_cast by making moving const
  // out of the cfa.h prototypes and into the invoking code.
  auto post_order = [&](cbb_ptr b) {
    order->push_front(const_cast<BasicBlock*>(b));
  };
  CFA<BasicBlock>::DepthFirstTraversal(root, get_structured_successors,
                                       ignore_block, post_order, terminal);
}